

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::remove_web_seed_conn(torrent *this,peer_connection *p)

{
  bool bVar1;
  _Self local_40;
  _List_node_base *local_38;
  _List_node_base *local_30;
  _List_iterator<libtorrent::aux::web_seed_t> local_28;
  _Self local_20;
  _List_iterator<libtorrent::aux::web_seed_t> i;
  peer_connection *p_local;
  torrent *this_local;
  
  i._M_node = (_List_node_base *)p;
  local_28._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::begin
                 (&this->m_web_seeds);
  local_30 = (_List_node_base *)
             ::std::__cxx11::
             list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                       (&this->m_web_seeds);
  local_38 = i._M_node;
  local_20._M_node =
       (_List_node_base *)
       ::std::
       find_if<std::_List_iterator<libtorrent::aux::web_seed_t>,libtorrent::aux::torrent::remove_web_seed_conn(libtorrent::aux::peer_connection*)::__0>
                 (local_28,(_List_iterator<libtorrent::aux::web_seed_t>)local_30,i._M_node);
  local_40._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                 (&this->m_web_seeds);
  bVar1 = ::std::operator==(&local_20,&local_40);
  if (!bVar1) {
    remove_web_seed_iter(this,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void torrent::remove_web_seed_conn(peer_connection* p)
	{
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [p] (web_seed_t const& ws) { return ws.peer_info.connection == p; });

		TORRENT_ASSERT(i != m_web_seeds.end());
		if (i == m_web_seeds.end()) return;
		remove_web_seed_iter(i);
	}